

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.h
# Opt level: O0

uint __thiscall Nova::Simplex_Mesh<3>::Add_Element(Simplex_Mesh<3> *this,INDEX *e)

{
  size_t sVar1;
  INDEX *e_local;
  Simplex_Mesh<3> *this_local;
  
  Array<Nova::Vector<int,_3,_true>_>::Append(&this->elements,e);
  sVar1 = Array<Nova::Vector<int,_3,_true>_>::size(&this->elements);
  return (uint)sVar1;
}

Assistant:

unsigned Add_Element(const INDEX& e)
    {
        elements.Append(e);
        return elements.size();
    }